

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

SectionTracker * Catch::TestCaseTracking::SectionTracker::acquire(TrackerContext *ctx,string *name)

{
  ITracker *parent;
  int iVar1;
  TrackerBase *in_RAX;
  undefined4 extraout_var;
  TrackerBase *this;
  int __oflag;
  pointer_____offset_0x10___ *__file;
  Ptr<Catch::TestCaseTracking::ITracker> local_28;
  
  __file = (pointer_____offset_0x10___ *)&local_28;
  parent = ctx->m_currentTracker;
  local_28.m_p = &in_RAX->super_ITracker;
  iVar1 = (*(parent->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
            _vptr_NonCopyable[0xe])(parent);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    this = (TrackerBase *)operator_new(0x60);
    SectionTracker((SectionTracker *)this,name,ctx,parent);
    local_28.m_p = (ITracker *)this;
    (*(((TrackerBase *)&this->super_ITracker)->super_ITracker).super_SharedImpl<Catch::IShared>.
      super_IShared.super_NonCopyable._vptr_NonCopyable[2])(this);
    (*(parent->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [0xd])(parent);
    Ptr<Catch::TestCaseTracking::ITracker>::~Ptr(&local_28);
  }
  else {
    __file = &ITracker::typeinfo;
    this = (TrackerBase *)
           __dynamic_cast(CONCAT44(extraout_var,iVar1),&ITracker::typeinfo,&typeinfo,0);
    if (this == (TrackerBase *)0x0) {
      __assert_fail("section",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]arena_allocator/test/catch.hpp"
                    ,0x1551,
                    "static SectionTracker &Catch::TestCaseTracking::SectionTracker::acquire(TrackerContext &, const std::string &)"
                   );
    }
  }
  if (ctx->m_runState != CompletedCycle) {
    iVar1 = (*(this->super_ITracker).super_SharedImpl<Catch::IShared>.super_IShared.
              super_NonCopyable._vptr_NonCopyable[5])(this);
    if ((char)iVar1 == '\0') {
      TrackerBase::open(this,(char *)__file,__oflag);
    }
  }
  return (SectionTracker *)this;
}

Assistant:

static SectionTracker& acquire( TrackerContext& ctx, std::string const& name ) {
            SectionTracker* section = CATCH_NULL;

            ITracker& currentTracker = ctx.currentTracker();
            if( ITracker* childTracker = currentTracker.findChild( name ) ) {
                section = dynamic_cast<SectionTracker*>( childTracker );
                assert( section );
            }
            else {
                section = new SectionTracker( name, ctx, &currentTracker );
                currentTracker.addChild( section );
            }
            if( !ctx.completedCycle() && !section->isComplete() ) {

                section->open();
            }
            return *section;
        }